

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memwatch.c
# Opt level: O0

char * mwStrdup(char *str,char *file,int line)

{
  size_t sVar1;
  char *newstring;
  size_t len;
  int line_local;
  char *file_local;
  char *str_local;
  
  if (str == (char *)0x0) {
    mwIncErr();
    mwWrite("strdup: <%ld> %s(%d), strdup(NULL) called\n",mwCounter,file,(ulong)(uint)line);
    mwFlush();
    str_local = (char *)0x0;
  }
  else {
    sVar1 = strlen(str);
    str_local = (char *)mwMalloc(sVar1 + 1,file,line);
    if (str_local != (char *)0x0) {
      memcpy(str_local,str,sVar1 + 1);
    }
  }
  return str_local;
}

Assistant:

char *mwStrdup(const char *str, const char *file, int line)
{
	size_t len;
	char *newstring;

	MW_MUTEX_LOCK();

	if (str == NULL) {
		mwIncErr();
		mwWrite("strdup: <%ld> %s(%d), strdup(NULL) called\n",
				mwCounter, file, line);
		FLUSH();
		MW_MUTEX_UNLOCK();
		return NULL;
	}

	len = strlen(str) + 1;
	newstring = (char *) mwMalloc(len, file, line);
	if (newstring != NULL) {
		memcpy(newstring, str, len);
	}
	MW_MUTEX_UNLOCK();
	return newstring;
}